

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill.hpp
# Opt level: O3

map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
* njoy::ENDFtk::file::
  Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ::fill(map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
         *__return_storage_ptr__,
        vector<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
        *sections)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  _Rb_tree_impl<std::less<int>,_true> *p_Var3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  _Rb_tree_color _Var6;
  _Base_ptr p_Var7;
  pointer __variants;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_bool>
  pVar8;
  int MT;
  map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
  map;
  anon_class_1_0_00000001 local_65;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_file_1_src_getSectionNumber_hpp:3:22),_const_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_&>
  local_64;
  _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __variants = (sections->
               super__Vector_base<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (sections->
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__variants != pvVar2) {
    do {
      local_64 = std::
                 visit<njoy::ENDFtk::file::Type<8>::getSectionNumber(std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>const&)::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>const&>
                           (&local_65,__variants);
      pVar8 = std::
              _Rb_tree<int,std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>,std::_Select1st<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>,std::less<int>,std::allocator<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>>
              ::
              _M_emplace_unique<int&,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
                        ((_Rb_tree<int,std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>,std::_Select1st<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>,std::less<int>,std::allocator<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>>
                          *)&local_60,&local_64,__variants);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        tools::Log::error<char_const*>("Section with duplicate section number found");
        tools::Log::info<char_const*>
                  ("Sections are required to specify a unique MT or section number");
        tools::Log::info<char_const*,int>("Encountered duplicate MT: {}",local_64);
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = getenv;
        __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
      }
      __variants = __variants + 1;
    } while (__variants != pvVar2);
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = &local_60._M_impl;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      goto LAB_0015c6c5;
    }
  }
  p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl;
  _Var6 = _S_red;
  p_Var7 = p_Var4;
LAB_0015c6c5:
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var7;
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var6;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static auto
fill( std::vector< Section >&& sections ) {

  std::map< int, Section > map;
  for ( auto&& section : sections ) {

    int MT = Derived::getSectionNumber( section );
    if ( not map.emplace( MT, std::move( section ) ).second ) {

      Log::error( "Section with duplicate section number found" );
      Log::info( "Sections are required to specify a unique MT or section number" );
      Log::info( "Encountered duplicate MT: {}", MT );
      throw std::exception();
    }
  }
  return map;
}